

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signature.h
# Opt level: O0

void __thiscall flow::Signature::Signature(Signature *this,Signature *param_1)

{
  Signature *param_1_local;
  Signature *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)param_1);
  this->returnType_ = param_1->returnType_;
  std::vector<flow::LiteralType,_std::allocator<flow::LiteralType>_>::vector
            (&this->args_,&param_1->args_);
  return;
}

Assistant:

Signature(const Signature&) = default;